

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnAtomicRmwCmpxchgExpr
          (BinaryReaderIR *this,Opcode opcode,Index memidx,Address alignment_log2,Address offset)

{
  char *__s;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aVar1;
  Result RVar2;
  LoadStoreExpr<(wabt::ExprType)2> *this_00;
  Location loc;
  _Head_base<0UL,_wabt::Expr_*,_false> local_110;
  Location local_108;
  Location local_e0;
  Var local_c0;
  Var local_78;
  
  __s = this->filename_;
  aVar1.offset = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_e0.field_1.field_0.last_column = 0;
  local_e0.filename._M_len = strlen(__s);
  local_e0.filename._M_str = __s;
  local_e0.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)aVar1.offset;
  Var::Var(&local_c0,memidx,&local_e0);
  this_00 = (LoadStoreExpr<(wabt::ExprType)2> *)operator_new(0xa0);
  Var::Var(&local_78,&local_c0);
  local_108.field_1.field_0.line = 0;
  local_108.field_1._4_8_ = 0;
  local_108.filename._M_len = 0;
  local_108.filename._M_str._0_4_ = 0;
  local_108.filename._M_str._4_4_ = 0;
  LoadStoreExpr<(wabt::ExprType)2>::LoadStoreExpr
            (this_00,opcode,&local_78,1L << ((byte)alignment_log2 & 0x3f),offset,&local_108);
  Var::~Var(&local_78);
  local_110._M_head_impl = (Expr *)this_00;
  RVar2 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_110);
  if ((LoadStoreExpr<(wabt::ExprType)2> *)local_110._M_head_impl !=
      (LoadStoreExpr<(wabt::ExprType)2> *)0x0) {
    (*(((MemoryExpr<(wabt::ExprType)2> *)&(local_110._M_head_impl)->_vptr_Expr)->
      super_ExprMixin<(wabt::ExprType)2>).super_Expr._vptr_Expr[1])();
  }
  Var::~Var(&local_c0);
  return (Result)RVar2.enum_;
}

Assistant:

Result BinaryReaderIR::OnAtomicRmwCmpxchgExpr(Opcode opcode,
                                              Index memidx,
                                              Address alignment_log2,
                                              Address offset) {
  return AppendExpr(std::make_unique<AtomicRmwCmpxchgExpr>(
      opcode, Var(memidx, GetLocation()), 1ull << alignment_log2, offset));
}